

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Mutex *this_00;
  int iVar1;
  _func_int **pp_Var2;
  ArrayDisposer **ppAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Directory *pDVar6;
  ArrayDisposer *pAVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  Exception *pEVar9;
  Directory *pDVar10;
  Directory *extraout_RDX;
  _func_int **pp_Var11;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  uint in_R8D;
  String *ptrCopy;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar12;
  Fault f;
  DebugExpression<bool> _kjCondition;
  undefined1 local_78 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_58;
  Exception *pEStack_50;
  uint local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  lVar8 = CONCAT44(in_register_0000000c,mode);
  pDVar10 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (lVar8 == 1) {
    this_00 = (Mutex *)(name_00.content.ptr + 1);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    kj::_::Mutex::lock(this_00,0);
    pp_Var2 = pDVar10[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var11 = (_func_int **)0x229f1b;
    }
    else {
      pp_Var11 = (pDVar10->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (size_t)pp_Var11;
    name.content.ptr = (char *)(name_00.content.ptr + 2);
    Impl::openEntry((Impl *)local_78,name,(int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0));
    uVar4 = local_78._0_8_;
    if ((Exception *)local_78._0_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      iVar1 = *(int *)(local_78._0_8_ + 0x18);
      if (iVar1 == 0) {
        local_48 = CONCAT31(local_48._1_3_,(char)in_R8D) & 0xffffff01;
        if ((in_R8D & 1) == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x6c8,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",
                     (DebugExpression<bool> *)&local_48);
          kj::_::Debug::Fault::fatal((Fault *)local_78);
        }
        pAVar7 = (ArrayDisposer *)(*(code *)**(undefined8 **)name_00.content.ptr[2].content.ptr)();
        name_00.content.ptr[4].content.disposer = pAVar7;
        newInMemoryDirectory
                  ((kj *)local_78,(Clock *)name_00.content.ptr[2].content.ptr,
                   (InMemoryFileFactory *)name_00.content.ptr[2].content.size_);
        local_58.ptr = (Waiter *)local_78._0_8_;
        pEStack_50 = (Exception *)local_78._8_8_;
        EntryImpl::init((EntryImpl *)&local_48,(EVP_PKEY_CTX *)uVar4);
        *(uint *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             local_48;
        *(undefined4 *)
         ((long)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode + 4) =
             uStack_44;
        *(undefined4 *)&(this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
             (undefined4)uStack_40;
        *(undefined4 *)((long)&(this->super_AtomicRefcounted).super_Disposer._vptr_Disposer + 4) =
             uStack_40._4_4_;
        uStack_40 = (InMemoryFileFactory *)0x0;
        if (pEStack_50 != (Exception *)0x0) {
          pEStack_50 = (Exception *)0x0;
          (**(code **)(((String *)&(local_58.ptr)->next)->content).ptr)();
        }
      }
      else {
        if (iVar1 == 3) {
          SymlinkNode::parse((Path *)local_78,(SymlinkNode *)(local_78._0_8_ + 0x20));
          kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
          uVar5 = local_78._8_8_;
          uVar4 = local_78._0_8_;
          path_00.parts.size_ = local_78._0_8_;
          path_00.parts.ptr = name_00.content.ptr;
          MVar12 = tryOpenSubdir(this,path_00,(WriteMode)local_78._8_8_);
          pDVar10 = MVar12.ptr.ptr;
          if ((Exception *)uVar4 != (Exception *)0x0) {
            local_78._0_8_ = (Exception *)0x0;
            local_78._8_8_ = (InMemoryFileFactory *)0x0;
            (***(_func_int ***)local_78._16_8_)
                      (local_78._16_8_,uVar4,0x18,uVar5,uVar5,
                       ArrayDisposer::Dispose_<kj::String>::destruct);
            pDVar10 = extraout_RDX_01;
          }
          goto LAB_001f03c8;
        }
        if (iVar1 == 2) {
          (**(code **)(*(long *)(((String *)(local_78._0_8_ + 0x28))->content).ptr + 0x28))
                    (local_78);
          pEVar9 = (Exception *)local_78._8_8_;
          if ((Exception *)local_78._8_8_ != (Exception *)0x0) {
            pEVar9 = (Exception *)local_78._0_8_;
          }
          (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
               (_func_int **)pEVar9;
          (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
               (_func_int **)local_78._8_8_;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                    ((Fault *)local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x6cc,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x201cf0);
          (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
               (_func_int **)0x0;
          (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
          kj::_::Debug::Fault::~Fault((Fault *)local_78);
        }
      }
    }
    kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    pDVar10 = extraout_RDX_02;
    goto LAB_001f03c8;
  }
  if (lVar8 == 0) {
    if ((in_R8D & 2) != 0) {
      LOCK();
      ppAVar3 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar3 = *(int *)ppAVar3 + 1;
      UNLOCK();
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&((name_00.content.ptr)->content).size_;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
      goto LAB_001f03c8;
    }
    pDVar6 = pDVar10;
    if ((in_R8D & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x49f,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)local_78);
      pDVar10 = extraout_RDX;
      goto LAB_001f03c8;
    }
  }
  else {
    pp_Var2 = pDVar10[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var11 = (_func_int **)0x229f1b;
    }
    else {
      pp_Var11 = (pDVar10->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var11;
    MVar12 = tryGetParent((InMemoryDirectory *)local_78,name_00,
                          (int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0));
    pDVar6 = MVar12.ptr.ptr;
    if ((Exception *)local_78._8_8_ != (Exception *)0x0) {
      (**(code **)(*(_func_int **)local_78._8_8_ + 0x88))
                (this,local_78._8_8_,pDVar10 + 3,lVar8 + -1,in_R8D);
      (**(code **)(((String *)local_78._0_8_)->content).ptr)
                (local_78._0_8_,
                 (EVP_PKEY_CTX *)(local_78._8_8_ + *(long *)(*(_func_int **)local_78._8_8_ + -0x10))
                );
      pDVar10 = extraout_RDX_00;
      goto LAB_001f03c8;
    }
  }
  pDVar10 = pDVar6;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
LAB_001f03c8:
  MVar12.ptr.ptr = pDVar10;
  MVar12.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar12.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, entry, mode);
      } else {
        return kj::none;
      }
    }